

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O2

void __thiscall ymfm::ym2203::generate(ym2203 *this,output_data *output,uint32_t numsamples)

{
  uint uVar1;
  int iVar2;
  uint32_t samp;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  
  if (this->m_fm_samples_per_output == '\0') {
    iVar5 = 0;
    for (iVar4 = 0; -numsamples != iVar4; iVar4 = iVar4 + -1) {
      uVar3 = (this->m_ssg_resampler).m_sampindex;
      uVar1 = (uVar3 + iVar5) / 3;
      if (uVar3 + uVar1 * -3 == iVar4) {
        clock_fm(this);
        iVar2 = (this->m_last_fm).data[0];
LAB_00173b56:
        output->data[0] = iVar2;
      }
      else {
        output->data[0] = (this->m_last_fm).data[0];
        if (uVar1 * -3 + uVar3 + -1 == iVar4) {
          clock_fm(this);
          iVar2 = ((this->m_last_fm).data[0] + output->data[0]) / 2;
          goto LAB_00173b56;
        }
      }
      iVar5 = iVar5 + 1;
      output = output + 1;
    }
  }
  else {
    for (uVar3 = 0; numsamples != uVar3; uVar3 = uVar3 + 1) {
      if (((this->m_ssg_resampler).m_sampindex + uVar3) % (uint)this->m_fm_samples_per_output == 0)
      {
        clock_fm(this);
      }
      output->data[0] = (this->m_last_fm).data[0];
      output = output + 1;
    }
  }
  ssg_resampler<ymfm::ymfm_output<4>,_1,_false>::resample
            (&this->m_ssg_resampler,output + -(ulong)numsamples,numsamples);
  return;
}

Assistant:

void ym2203::generate(output_data *output, uint32_t numsamples)
{
	// FM output is just repeated the prescale number of times; note that
	// 0 is a special 1.5 case
	if (m_fm_samples_per_output != 0)
	{
		for (uint32_t samp = 0; samp < numsamples; samp++, output++)
		{
			if ((m_ssg_resampler.sampindex() + samp) % m_fm_samples_per_output == 0)
				clock_fm();
			output->data[0] = m_last_fm.data[0];
		}
	}
	else
	{
		for (uint32_t samp = 0; samp < numsamples; samp++, output++)
		{
			uint32_t step = (m_ssg_resampler.sampindex() + samp) % 3;
			if (step == 0)
				clock_fm();
			output->data[0] = m_last_fm.data[0];
			if (step == 1)
			{
				clock_fm();
				output->data[0] = (output->data[0] + m_last_fm.data[0]) / 2;
			}
		}
	}

	// resample the SSG as configured
	m_ssg_resampler.resample(output - numsamples, numsamples);
}